

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base58.c
# Opt level: O3

ssize_t coda_base58_decode_alloc(char *in,size_t inlen,char **out)

{
  size_t sVar1;
  char *out_00;
  size_t sVar2;
  size_t __size;
  ssize_t sVar3;
  
  sVar3 = 1;
  __size = 1;
  if (inlen != 0) {
    sVar2 = 0;
    sVar1 = inlen;
    do {
      if (in[sVar2] != '1') goto LAB_001019db;
      sVar2 = sVar2 + 1;
      sVar1 = sVar1 - 1;
    } while (sVar1 != 0);
    sVar1 = 0;
    sVar2 = inlen;
LAB_001019db:
    __size = sVar2 + (sVar1 * 0x2dd) / 1000 + 1;
  }
  out_00 = (char *)malloc(__size);
  *out = out_00;
  if (out_00 != (char *)0x0) {
    sVar3 = coda_base58_decode(in,inlen,out_00);
    if (sVar3 < 0) {
      free(*out);
      *out = (char *)0x0;
    }
  }
  return sVar3;
}

Assistant:

ssize_t coda_base58_decode_alloc (const char *in, size_t inlen, char **out)
{
    size_t zeroes = 0;
    size_t b256len = inlen;

    while (b256len && in[zeroes] == '1')
    {
        zeroes++;
        b256len--;
    }

    size_t needlen = zeroes + b256len * 733 / 1000 + 1;
    *out = malloc (needlen);
    if (!*out)
        return true;

    ssize_t ret = coda_base58_decode (in, inlen, *out);
    if (ret < 0)
    {
        free (*out);
        *out = NULL;
        return ret;
    }

    return ret;
}